

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing)

{
  Location *pLVar1;
  LogMessage *pLVar2;
  string *psVar3;
  LogFinisher local_99;
  LogMessage local_98;
  LogMessage local_60;
  
  if ((this->location_->_has_bits_[0] & 4) != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x16b);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if ((this->location_->_has_bits_[0] & 8) != 0) {
    internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x16c);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_98,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_99,pLVar2);
    internal::LogMessage::~LogMessage(&local_98);
  }
  if (leading->_M_string_length != 0) {
    pLVar1 = this->location_;
    pLVar1->_has_bits_[0] = pLVar1->_has_bits_[0] | 4;
    if (pLVar1->leading_comments_ == (string *)&internal::kEmptyString_abi_cxx11_) {
      psVar3 = (string *)operator_new(0x20);
      (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
      psVar3->_M_string_length = 0;
      (psVar3->field_2)._M_local_buf[0] = '\0';
      pLVar1->leading_comments_ = psVar3;
    }
    std::__cxx11::string::swap((string *)pLVar1->leading_comments_);
  }
  if (trailing->_M_string_length != 0) {
    pLVar1 = this->location_;
    pLVar1->_has_bits_[0] = pLVar1->_has_bits_[0] | 8;
    if (pLVar1->trailing_comments_ == (string *)&internal::kEmptyString_abi_cxx11_) {
      psVar3 = (string *)operator_new(0x20);
      (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
      psVar3->_M_string_length = 0;
      (psVar3->field_2)._M_local_buf[0] = '\0';
      pLVar1->trailing_comments_ = psVar3;
    }
    std::__cxx11::string::swap((string *)pLVar1->trailing_comments_);
  }
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    string* leading, string* trailing) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
}